

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  DielectricInterfaceBxDF *pDVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  TransportMode mode_00;
  uint uVar20;
  BxDFFlags BVar21;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *pLVar22;
  ulong uVar23;
  undefined4 in_register_00000034;
  IdealDiffuseBxDF *this_00;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar32;
  float fVar33;
  float fVar34;
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar41 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar48 [64];
  undefined1 in_ZMM5 [64];
  undefined1 in_XMM6 [16];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> toInterface;
  BSDFSample wos;
  BSDFSample wis;
  float local_120;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_f8;
  float local_e8;
  float fStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  float local_d8;
  float fStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  Tuple2<pbrt::Point2,_float> local_c8;
  IdealDiffuseBxDF *local_c0;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_b8;
  float local_a4;
  BSDFSample local_a0;
  BSDFSample local_7c;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar42 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  
  auVar48._4_60_ = wi._12_60_;
  auVar48._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar28 = auVar48._0_16_;
  fVar43 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_e4 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_e0 = (uint)in_XMM2_Qb;
  uStack_dc = (uint)((ulong)in_XMM2_Qb >> 0x20);
  local_d8 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_d4 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d0 = (uint)in_XMM0_Qb;
  uStack_cc = (uint)((ulong)in_XMM0_Qb >> 0x20);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bxdfs.h"
               ,0x41e,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided != '\0') && (fVar43 < 0.0)) {
    local_d8 = -local_d8;
    fStack_d4 = -fStack_d4;
    uStack_d0 = uStack_d0 ^ 0x80000000;
    uStack_cc = uStack_cc ^ 0x80000000;
    fVar43 = -fVar43;
    auVar28._0_8_ = CONCAT44(wi._12_4_,auVar48._0_4_) ^ 0x8000000080000000;
    auVar28._8_4_ = wi._16_4_ ^ 0x80000000;
    auVar28._12_4_ = wi._20_4_ ^ 0x80000000;
    local_e8 = -local_e8;
    fStack_e4 = -fStack_e4;
    uStack_e0 = uStack_e0 ^ 0x80000000;
    uStack_dc = uStack_dc ^ 0x80000000;
  }
  wi_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar28._0_4_;
  local_a4 = wi_00.super_Tuple3<pbrt::Vector3,_float>.z * fVar43;
  local_120 = 0.0;
  uVar26 = *(uint *)(Options + 4);
  if (0.0 < local_a4) {
    auVar36._0_4_ = (float)(this->config).nSamples;
    auVar36._4_12_ = in_ZMM5._4_12_;
    in_ZMM5 = ZEXT1664(auVar36);
    if (0.0 < fVar43) {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
      in_register_00000034 = 0;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
      auVar42._0_4_ = DielectricInterfaceBxDF::PDF(&this->top,wo_00,wi_00,mode,Reflection);
      auVar42._4_60_ = extraout_var;
      auVar36 = vfmadd213ss_fma(auVar42._0_16_,ZEXT416((uint)auVar36._0_4_),ZEXT416(0));
      local_120 = auVar36._0_4_;
    }
    else {
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl(auVar28,auVar27);
      auVar36 = vfmadd213ss_fma(ZEXT416((uint)(auVar27._0_4_ * 0.31830987)),auVar36,
                                ZEXT816(0) << 0x40);
      local_120 = auVar36._0_4_;
    }
  }
  fVar34 = 0.0;
  if ((this->config).nSamples != '\0') {
    uVar23 = CONCAT44(fStack_d4,local_d8) * -0x395b586ca42e166b;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar28 = vandps_avx512vl(auVar28,auVar4);
    uVar24 = CONCAT44(fStack_e4,local_e8) * -0x395b586ca42e166b;
    uVar23 = (CONCAT44(in_register_00000034,fVar43) ^
             ((uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar25 = (uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b;
    local_58 = ZEXT416((uint)(auVar28._0_4_ * 0.31830987));
    uVar23 = (CONCAT44(0x4fb7dae8,wi_00.super_Tuple3<pbrt::Vector3,_float>.z) ^
             ((uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar25 = (uVar26 & 0xffffff ^ uVar25 ^ 0x1a929e4d6f47a654 ^
             (uVar25 >> 0x2f | (ulong)(uVar26 & 0xff000000))) * -0x395b586ca42e166b;
    uVar24 = (uVar23 >> 0x2f ^ uVar23) * -0x395b586ca42e166b;
    uVar23 = (uVar25 >> 0x2f ^ uVar25) * -0x395b586ca42e166b;
    uVar23 = uVar23 >> 0x2f ^ uVar23;
    lVar1 = uVar23 * 2 + 1;
    uVar23 = ((uVar24 >> 0x2f ^ uVar24) + 1) * 0x5851f42d4c957f2d + uVar23 * -0x4f5c17a566d501a4 + 1
    ;
    local_c0 = &this->bottom;
    uVar26 = 0;
    mode_00 = (TransportMode)(mode == Radiance);
    do {
      bVar3 = (byte)(uVar23 >> 0x38);
      uVar20 = (uint)(uVar23 >> 0x20);
      if (local_a4 <= 0.0) {
        if (0.0 < fVar43) {
          local_f8.bottom = (IdealDiffuseBxDF *)0x0;
          local_f8.top = &this->top;
          this_00 = (IdealDiffuseBxDF *)0x0;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_c0;
          local_b8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar19 << 0x40);
          pLVar22 = this;
        }
        else {
          local_b8.bottom = (IdealDiffuseBxDF *)0x0;
          local_b8.top = &this->top;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_c0;
          local_f8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar18 << 0x40);
          pLVar22 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0;
          this_00 = local_c0;
        }
        uVar20 = uVar20 >> 0xd ^ (uint)(uVar23 >> 0x1b);
        bVar3 = bVar3 >> 3;
        auVar28 = vcvtusi2ss_avx512f(in_XMM6,uVar20 >> bVar3 | uVar20 << 0x20 - bVar3);
        uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar24 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar23;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar24;
        auVar36 = vpunpcklqdq_avx(auVar38,auVar46);
        auVar27 = vpsrlvq_avx2(auVar36,_DAT_006015a0);
        auVar4 = vpsrlvq_avx2(auVar36,_DAT_006015b0);
        auVar36 = vpsrlq_avx(auVar36,0x3b);
        auVar36 = vpshufd_avx(auVar36,0xe8);
        auVar27 = vpshufd_avx(auVar27 ^ auVar4,0xe8);
        auVar36 = vprorvd_avx512vl(auVar27,auVar36);
        auVar36 = vcvtudq2ps_avx512vl(auVar36);
        auVar11._8_4_ = 0x2f800000;
        auVar11._0_8_ = 0x2f8000002f800000;
        auVar11._12_4_ = 0x2f800000;
        auVar36 = vmulps_avx512vl(auVar36,auVar11);
        auVar12._8_4_ = 0x3f7fffff;
        auVar12._0_8_ = 0x3f7fffff3f7fffff;
        auVar12._12_4_ = 0x3f7fffff;
        auVar36 = vminps_avx512vl(auVar36,auVar12);
        local_c8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar36);
        if (pLVar22 == (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
          wo_06.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_06.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_06.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
          IdealDiffuseBxDF::Sample_f
                    (&local_a0,this_00,wo_06,auVar28._0_4_,(Point2f *)&local_c8,mode,All);
        }
        else {
          wo_05.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_05.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_05.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
          DielectricInterfaceBxDF::Sample_f
                    (&local_a0,&pLVar22->top,wo_05,auVar28._0_4_,(Point2f *)&local_c8,mode,All);
        }
        uVar23 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        if ((0.0 < local_a0.pdf) &&
           (((local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
             (NAN(local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
            (((undefined1)local_a0.flags & Reflection) == Unset)))) {
          uVar20 = (uint)(uVar23 >> 0x2d) ^ (uint)(uVar23 >> 0x1b);
          bVar3 = (byte)(uVar23 >> 0x3b);
          auVar28 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,uVar20 >> bVar3 | uVar20 << 0x20 - bVar3);
          uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar24 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar23;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar24;
          auVar36 = vpunpcklqdq_avx(auVar39,auVar47);
          auVar27 = vpsrlvq_avx2(auVar36,_DAT_006015a0);
          auVar4 = vpsrlvq_avx2(auVar36,_DAT_006015b0);
          auVar36 = vpsrlq_avx(auVar36,0x3b);
          auVar36 = vpshufd_avx(auVar36,0xe8);
          auVar27 = vpshufd_avx(auVar27 ^ auVar4,0xe8);
          auVar36 = vprorvd_avx512vl(auVar27,auVar36);
          auVar36 = vcvtudq2ps_avx512vl(auVar36);
          auVar13._8_4_ = 0x2f800000;
          auVar13._0_8_ = 0x2f8000002f800000;
          auVar13._12_4_ = 0x2f800000;
          auVar36 = vmulps_avx512vl(auVar36,auVar13);
          auVar14._8_4_ = 0x3f7fffff;
          auVar14._0_8_ = 0x3f7fffff3f7fffff;
          auVar14._12_4_ = 0x3f7fffff;
          auVar36 = vminps_avx512vl(auVar36,auVar14);
          local_c8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar36);
          if (local_b8.top == (DielectricInterfaceBxDF *)0x0) {
            wo_09.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wo_09.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_09.super_Tuple3<pbrt::Vector3,_float>.z = wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
            IdealDiffuseBxDF::Sample_f
                      (&local_7c,local_b8.bottom,wo_09,auVar28._0_4_,(Point2f *)&local_c8,mode_00,
                       All);
          }
          else {
            wo_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wo_07.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_07.super_Tuple3<pbrt::Vector3,_float>.z = wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
            DielectricInterfaceBxDF::Sample_f
                      (&local_7c,local_b8.top,wo_07,auVar28._0_4_,(Point2f *)&local_c8,mode_00,All);
          }
          if (((0.0 < local_7c.pdf) &&
              ((local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) &&
             (((undefined1)local_7c.flags & Reflection) == Unset)) {
            BVar21 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                               (&local_f8);
            if ((BVar21 & Specular) == Unset) {
              BVar21 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                                 (&local_b8);
              wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                   -local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              if ((BVar21 & Specular) == Unset) {
                if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                    local_f8.top ==
                    (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
                  auVar15._8_4_ = 0x7fffffff;
                  auVar15._0_8_ = 0x7fffffff7fffffff;
                  auVar15._12_4_ = 0x7fffffff;
                  auVar28 = vandps_avx512vl(ZEXT416((uint)local_7c.wi.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                            auVar15);
                  auVar36 = ZEXT816(0);
                  uVar5 = vcmpss_avx512f(auVar36,ZEXT416((uint)(fVar43 * wi_02.
                                                  super_Tuple3<pbrt::Vector3,_float>.z)),1);
                  fVar34 = (float)((uint)((byte)uVar5 & 1) * (int)(auVar28._0_4_ * 0.31830987));
                  uVar30 = 0;
                  uVar31 = 0;
                  uVar32 = 0;
                }
                else {
                  wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                       local_7c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  wo_10.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
                  wo_10.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
                  wo_10.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
                  fVar34 = DielectricInterfaceBxDF::PDF(local_f8.top,wo_10,wi_02,mode,All);
                  auVar36 = ZEXT816(0) << 0x40;
                  uVar30 = extraout_XMM0_Db;
                  uVar31 = extraout_XMM0_Dc;
                  uVar32 = extraout_XMM0_Dd;
                }
                wo_12.super_Tuple3<pbrt::Vector3,_float>.z =
                     -local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                if (local_b8.top == (DielectricInterfaceBxDF *)0x0) {
                  uVar5 = vcmpss_avx512f(auVar36,ZEXT416((uint)(wo_12.
                                                  super_Tuple3<pbrt::Vector3,_float>.z *
                                                  wi_00.super_Tuple3<pbrt::Vector3,_float>.z)),1);
                  wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                       (float)((uint)((byte)uVar5 & 1) * local_58._0_4_);
                }
                else {
                  wi_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
                  wi_04.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
                  wo_12.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                       local_a0.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                  wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                       wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
                  local_48 = fVar34;
                  uStack_44 = uVar30;
                  uStack_40 = uVar31;
                  uStack_3c = uVar32;
                  wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                       DielectricInterfaceBxDF::PDF(local_b8.top,wo_12,wi_04,mode,All);
                  fVar34 = local_48;
                }
                fVar34 = (fVar34 + wi_02.super_Tuple3<pbrt::Vector3,_float>.z) * 0.5;
                goto LAB_0037d068;
              }
              if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_f8.top
                  == (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
                auVar17._8_4_ = 0x7fffffff;
                auVar17._0_8_ = 0x7fffffff7fffffff;
                auVar17._12_4_ = 0x7fffffff;
                auVar28 = vandps_avx512vl(ZEXT416((uint)local_7c.wi.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                          auVar17);
                fVar33 = auVar28._0_4_;
                fVar34 = fVar43 * wi_02.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar28 = SUB6416(ZEXT864(0),0);
                goto LAB_0037cee3;
              }
              auVar41._8_8_ = 0;
              auVar41._0_4_ = local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.x;
              auVar41._4_4_ = local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.y;
              auVar16._8_4_ = 0x80000000;
              auVar16._0_8_ = 0x8000000080000000;
              auVar16._12_4_ = 0x80000000;
              auVar29 = vxorps_avx512vl(auVar41,auVar16);
              auVar40._4_4_ = fStack_d4;
              auVar40._0_4_ = local_d8;
              auVar40._8_4_ = uStack_d0;
              auVar40._12_4_ = uStack_cc;
              pLVar22 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                        local_f8.top;
              fVar34 = fVar43;
            }
            else {
              fVar34 = -local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_b8.top
                  == (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
                uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x20,
                                       ZEXT416((uint)(fVar34 * wi_00.
                                                  super_Tuple3<pbrt::Vector3,_float>.z)),1);
                bVar3 = (byte)uVar5;
                fVar34 = (float)local_58._0_4_;
                goto LAB_0037cf9b;
              }
              auVar40._0_8_ =
                   local_a0.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar40._8_4_ = 0x80000000;
              auVar40._12_4_ = 0x80000000;
              auVar29._4_4_ = fStack_e4;
              auVar29._0_4_ = local_e8;
              auVar29._8_4_ = uStack_e0;
              auVar29._12_4_ = uStack_dc;
              pLVar22 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                        local_b8.top;
              wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                   wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
            }
LAB_0037cf67:
            wo_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar40._0_8_;
            wo_11.super_Tuple3<pbrt::Vector3,_float>.z = fVar34;
            wi_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar29._0_8_;
            wi_03.super_Tuple3<pbrt::Vector3,_float>.z = wi_02.super_Tuple3<pbrt::Vector3,_float>.z;
            fVar34 = DielectricInterfaceBxDF::PDF(&pLVar22->top,wo_11,wi_03,mode,All);
            goto LAB_0037d068;
          }
          goto LAB_0037d078;
        }
      }
      else {
        uVar20 = uVar20 >> 0xd ^ (uint)(uVar23 >> 0x1b);
        bVar3 = bVar3 >> 3;
        uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        auVar28 = vcvtusi2ss_avx512f(in_XMM6,uVar20 >> bVar3 | uVar20 << 0x20 - bVar3);
        uVar24 = uVar23 * 0x5851f42d4c957f2d + lVar1;
        auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        auVar35._8_8_ = 0;
        auVar35._0_8_ = uVar23;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar24;
        auVar36 = vpunpcklqdq_avx(auVar35,auVar44);
        auVar27 = vpsrlvq_avx2(auVar36,_DAT_006015a0);
        auVar4 = vpsrlvq_avx2(auVar36,_DAT_006015b0);
        auVar36 = vpsrlq_avx(auVar36,0x3b);
        auVar36 = vpshufd_avx(auVar36,0xe8);
        auVar27 = vpshufd_avx(auVar27 ^ auVar4,0xe8);
        auVar36 = vprorvd_avx512vl(auVar27,auVar36);
        auVar36 = vcvtudq2ps_avx512vl(auVar36);
        auVar6._8_4_ = 0x2f800000;
        auVar6._0_8_ = 0x2f8000002f800000;
        auVar6._12_4_ = 0x2f800000;
        auVar36 = vmulps_avx512vl(auVar36,auVar6);
        auVar7._8_4_ = 0x3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar7._12_4_ = 0x3f7fffff;
        auVar36 = vminps_avx512vl(auVar36,auVar7);
        pDVar2 = (DielectricInterfaceBxDF *)vmovlps_avx(auVar36);
        local_f8.top = pDVar2;
        if (0.0 < fVar43) {
          wo_02.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_02.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
          DielectricInterfaceBxDF::Sample_f
                    (&local_a0,&this->top,wo_02,auVar28._0_4_,(Point2f *)&local_f8,mode,All);
        }
        else {
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
          IdealDiffuseBxDF::Sample_f
                    (&local_a0,local_c0,wo_01,auVar28._0_4_,(Point2f *)&local_f8,mode,All);
        }
        uVar23 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        if (((local_a0.pdf <= 0.0) ||
            ((local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
             (!NAN(local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) ||
           (((undefined1)local_a0.flags & Reflection) != Unset)) {
          fVar34 = (float)local_58._0_4_;
          if (0.0 < fVar43) {
            wo_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_d4;
            wo_04.super_Tuple3<pbrt::Vector3,_float>.x = local_d8;
            wi_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wi_01.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar43;
            wi_01.super_Tuple3<pbrt::Vector3,_float>.z = wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
            fVar34 = DielectricInterfaceBxDF::PDF(&this->top,wo_04,wi_01,mode,All);
          }
          local_120 = local_120 + fVar34;
        }
        else {
          uVar20 = (uint)(uVar23 >> 0x2d) ^ (uint)(uVar23 >> 0x1b);
          bVar3 = (byte)(uVar23 >> 0x3b);
          uVar23 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          uVar24 = uVar23 * 0x5851f42d4c957f2d + lVar1;
          auVar28 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,uVar20 >> bVar3 | uVar20 << 0x20 - bVar3);
          auVar28 = vminss_avx(ZEXT416((uint)(auVar28._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar23;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar24;
          auVar36 = vpunpcklqdq_avx(auVar37,auVar45);
          auVar27 = vpsrlvq_avx2(auVar36,_DAT_006015a0);
          auVar4 = vpsrlvq_avx2(auVar36,_DAT_006015b0);
          auVar36 = vpsrlq_avx(auVar36,0x3b);
          auVar36 = vpshufd_avx(auVar36,0xe8);
          auVar27 = vpshufd_avx(auVar27 ^ auVar4,0xe8);
          auVar36 = vprorvd_avx512vl(auVar27,auVar36);
          auVar36 = vcvtudq2ps_avx512vl(auVar36);
          auVar8._8_4_ = 0x2f800000;
          auVar8._0_8_ = 0x2f8000002f800000;
          auVar8._12_4_ = 0x2f800000;
          auVar36 = vmulps_avx512vl(auVar36,auVar8);
          auVar9._8_4_ = 0x3f7fffff;
          auVar9._0_8_ = 0x3f7fffff3f7fffff;
          auVar9._12_4_ = 0x3f7fffff;
          auVar36 = vminps_avx512vl(auVar36,auVar9);
          pDVar2 = (DielectricInterfaceBxDF *)vmovlps_avx(auVar36);
          local_f8.top = pDVar2;
          if (0.0 < fVar43) {
            wo_08.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wo_08.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_08.super_Tuple3<pbrt::Vector3,_float>.z = wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
            DielectricInterfaceBxDF::Sample_f
                      (&local_7c,&this->top,wo_08,auVar28._0_4_,(Point2f *)&local_f8,mode_00,All);
          }
          else {
            wo_03.super_Tuple3<pbrt::Vector3,_float>.y = fStack_e4;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.x = local_e8;
            wo_03.super_Tuple3<pbrt::Vector3,_float>.z = wi_00.super_Tuple3<pbrt::Vector3,_float>.z;
            IdealDiffuseBxDF::Sample_f
                      (&local_7c,local_c0,wo_03,auVar28._0_4_,(Point2f *)&local_f8,mode_00,All);
          }
          auVar28 = ZEXT816(0) << 0x40;
          if ((0.0 < local_7c.pdf) &&
             (((local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
               (NAN(local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
              (((undefined1)local_7c.flags & Reflection) == Unset)))) {
            if (fVar43 <= 0.0) {
              wi_02.super_Tuple3<pbrt::Vector3,_float>.z =
                   -local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar29._0_8_ =
                   local_7c.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar29._8_4_ = 0x80000000;
              auVar29._12_4_ = 0x80000000;
              auVar40._0_8_ =
                   local_a0.wi.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
              auVar40._8_4_ = 0x80000000;
              auVar40._12_4_ = 0x80000000;
              pLVar22 = this;
              fVar34 = -local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              goto LAB_0037cf67;
            }
            fVar34 = local_a0.wi.super_Tuple3<pbrt::Vector3,_float>.z *
                     local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z;
            auVar10._8_4_ = 0x7fffffff;
            auVar10._0_8_ = 0x7fffffff7fffffff;
            auVar10._12_4_ = 0x7fffffff;
            auVar36 = vandps_avx512vl(ZEXT416((uint)local_7c.wi.super_Tuple3<pbrt::Vector3,_float>.z
                                             ),auVar10);
            fVar33 = auVar36._0_4_;
LAB_0037cee3:
            uVar5 = vcmpss_avx512f(auVar28,ZEXT416((uint)fVar34),1);
            bVar3 = (byte)uVar5;
            fVar34 = fVar33 * 0.31830987;
LAB_0037cf9b:
            fVar34 = (float)((uint)(bVar3 & 1) * (int)fVar34);
LAB_0037d068:
            local_120 = local_120 + fVar34;
          }
LAB_0037d078:
          uVar23 = uVar24 * 0x5851f42d4c957f2d + lVar1;
        }
      }
      bVar3 = (this->config).nSamples;
      uVar26 = uVar26 + 1;
    } while (uVar26 < bVar3);
    fVar34 = (float)bVar3;
  }
  return (local_120 / fVar34) * 0.9 + 0.007957749;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }